

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YinYang.cpp
# Opt level: O2

double __thiscall YinYang::coordinateY(YinYang *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double local_18;
  
  if (G == 0) {
    dVar2 = this->theta2_lb + this->d_theta2 * (double)K;
    this->theta1 = this->theta1_lb + this->d_theta1 * (double)J;
    this->theta2 = dVar2;
    local_18 = (this->super_Parameterization).radius;
  }
  else {
    if (G != 1) {
      return (this->super_Parameterization).y;
    }
    dVar2 = this->theta2_lb + this->d_theta2 * (double)K;
    this->theta1 = this->theta1_lb + this->d_theta1 * (double)J;
    this->theta2 = dVar2;
    local_18 = -(this->super_Parameterization).radius;
  }
  dVar2 = sin(dVar2);
  dVar1 = cos(this->theta1);
  dVar1 = dVar1 * dVar2 * local_18;
  (this->super_Parameterization).y = dVar1;
  return dVar1;
}

Assistant:

double YinYang::coordinateY(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Yin
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      y = radius * sin(theta2) * cos(theta1);
      break;
    case 1:  // Yang
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      //y = radius * cos(theta2);
      y = -radius * sin(theta2) * cos(theta1);
      break;
  }

  return y;
}